

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf.c
# Opt level: O3

uint fl_utf8froma(char *dst,uint dstlen,char *src,uint srclen)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  byte *pbVar4;
  byte bVar5;
  
  pbVar4 = (byte *)(src + srclen);
  if (dstlen == 0) {
    uVar3 = 0;
LAB_001fe532:
    for (; src < pbVar4; src = (char *)((byte *)src + 1)) {
      uVar3 = uVar3 + ((byte)*src >> 7) + 1;
    }
  }
  else {
    if (srclen == 0) {
      uVar1 = 0;
    }
    else {
      uVar1 = 0;
      do {
        bVar5 = *src;
        iVar2 = (int)uVar1;
        if ((char)bVar5 < '\0') {
          uVar3 = iVar2 + 2;
          if (dstlen <= uVar3) {
            dst[uVar1] = '\0';
            src = (char *)((byte *)src + 1);
            goto LAB_001fe532;
          }
          dst[uVar1] = bVar5 >> 6 | 0xc0;
          dst[iVar2 + 1] = bVar5 & 0xbf;
        }
        else {
          uVar3 = iVar2 + 1;
          if (dstlen <= uVar3) {
            bVar5 = 0;
          }
          dst[uVar1] = bVar5;
          if (dstlen <= uVar3) {
            src = (char *)((byte *)src + 1);
            goto LAB_001fe532;
          }
        }
        uVar1 = (ulong)uVar3;
        src = (char *)((byte *)src + 1);
      } while (src < pbVar4);
    }
    uVar3 = (uint)uVar1;
    dst[uVar1] = '\0';
  }
  return uVar3;
}

Assistant:

unsigned fl_utf8froma(char* dst, unsigned dstlen,
		   const char* src, unsigned srclen) {
  const char* p = src;
  const char* e = src+srclen;
  unsigned count = 0;
  if (dstlen) for (;;) {
    unsigned char ucs;
    if (p >= e) {dst[count] = 0; return count;}
    ucs = *(const unsigned char*)p++;
    if (ucs < 0x80U) {
      dst[count++] = ucs;
      if (count >= dstlen) {dst[count-1] = 0; break;}
    } else { /* 2 bytes (note that CP1252 translate could make 3 bytes!) */
      if (count+2 >= dstlen) {dst[count] = 0; count += 2; break;}
      dst[count++] = 0xc0 | (ucs >> 6);
      dst[count++] = 0x80 | (ucs & 0x3F);
    }
  }
  /* we filled dst, measure the rest: */
  while (p < e) {
    unsigned char ucs = *(const unsigned char*)p++;
    if (ucs < 0x80U) {
      count++;
    } else {
      count += 2;
    }
  }
  return count;
}